

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::RegularExpression::matchString
          (RegularExpression *this,Context *context,XMLCh *literal,XMLSize_t *offset,bool ignoreCase
          )

{
  short *psVar1;
  bool bVar2;
  XMLSize_t XVar3;
  long lVar4;
  XMLSize_t charCount;
  
  if (literal == (XMLCh *)0x0) {
    XVar3 = *offset;
    charCount = 0;
  }
  else {
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)literal + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    charCount = (lVar4 >> 1) - 1;
    XVar3 = *offset;
    if (context->fLimit - XVar3 < charCount) {
      return false;
    }
  }
  if (ignoreCase) {
    bVar2 = XMLString::regionIMatches(context->fString,(int)XVar3,literal,0,charCount);
  }
  else {
    bVar2 = XMLString::regionMatches(context->fString,(int)XVar3,literal,0,charCount);
  }
  if (bVar2 != false) {
    *offset = *offset + charCount;
  }
  return bVar2 != false;
}

Assistant:

bool RegularExpression::matchString(Context* const context,
                                    const XMLCh* const literal, XMLSize_t& offset,
                                    const bool ignoreCase) const
{
    XMLSize_t length = XMLString::stringLen(literal);

    if (context->fLimit - offset < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString, (int)offset,
                                                        literal, 0, length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       literal, 0, length);
    if (match) offset += length;
    return match;
}